

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::lts_20250127::Cord::RemovePrefix(Cord *this,size_t n)

{
  undefined8 uVar1;
  bool bVar2;
  size_t sVar3;
  Nullable<absl::cord_internal::CordRep_*> rep_00;
  Nullable<absl::cord_internal::CordzInfo_*> info;
  CordRepBtree *this_00;
  CordRepSubstring *pCVar4;
  CordRep *pCVar5;
  AlphaNum *in_R9;
  CordRep *rep;
  CordRep *old;
  CordzUpdateScope scope;
  Nullable<CordRep_*> pCStack_148;
  MethodIdentifier method;
  CordRep *tree;
  char *local_138;
  char *absl_raw_log_internal_filename;
  AlphaNum local_100;
  AlphaNum local_d0;
  AlphaNum local_a0;
  string local_70;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string death_message;
  size_t n_local;
  Cord *this_local;
  
  death_message.field_2._8_8_ = n;
  sVar3 = size(this);
  if (n <= sVar3) {
    InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
    rep_00 = InlineRep::tree(&this->contents_);
    if (rep_00 == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
      InlineRep::remove_prefix(&this->contents_,death_message.field_2._8_8_);
    }
    else {
      scope.info_._4_4_ = 0x15;
      info = InlineRep::cordz_info(&this->contents_);
      cord_internal::CordzUpdateScope::CordzUpdateScope((CordzUpdateScope *)&old,info,kRemovePrefix)
      ;
      pCStack_148 = cord_internal::RemoveCrcNode(rep_00);
      if ((ulong)death_message.field_2._8_8_ < pCStack_148->length) {
        bVar2 = cord_internal::CordRep::IsBtree(pCStack_148);
        if (bVar2) {
          this_00 = cord_internal::CordRep::btree(pCStack_148);
          pCVar5 = cord_internal::CordRepBtree::SubTree
                             (this_00,death_message.field_2._8_8_,
                              pCStack_148->length - death_message.field_2._8_8_);
          cord_internal::CordRep::Unref(pCStack_148);
          pCStack_148 = pCVar5;
        }
        else {
          bVar2 = cord_internal::CordRep::IsSubstring(pCStack_148);
          if ((bVar2) &&
             (bVar2 = cord_internal::RefcountAndFlags::IsOne(&pCStack_148->refcount),
             uVar1 = death_message.field_2._8_8_, bVar2)) {
            pCVar4 = cord_internal::CordRep::substring(pCStack_148);
            pCVar4->start = uVar1 + pCVar4->start;
            pCStack_148->length = pCStack_148->length - death_message.field_2._8_8_;
          }
          else {
            pCVar5 = cord_internal::CordRepSubstring::Substring
                               (pCStack_148,death_message.field_2._8_8_,
                                pCStack_148->length - death_message.field_2._8_8_);
            cord_internal::CordRep::Unref(pCStack_148);
            pCStack_148 = pCVar5;
          }
        }
      }
      else {
        cord_internal::CordRep::Unref(pCStack_148);
        pCStack_148 = (Nullable<CordRep_*>)0x0;
      }
      InlineRep::SetTreeOrEmpty(&this->contents_,pCStack_148,(CordzUpdateScope *)&old);
      cord_internal::CordzUpdateScope::~CordzUpdateScope((CordzUpdateScope *)&old);
    }
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"Check n <= size() failed: ",&local_39);
  std::allocator<char>::~allocator(&local_39);
  AlphaNum::AlphaNum(&local_a0,"Requested prefix size ");
  AlphaNum::AlphaNum(&local_d0,death_message.field_2._8_8_);
  AlphaNum::AlphaNum(&local_100," exceeds Cord\'s size ");
  sVar3 = size(this);
  AlphaNum::AlphaNum((AlphaNum *)&absl_raw_log_internal_filename,sVar3);
  StrCat_abi_cxx11_(&local_70,(lts_20250127 *)&local_a0,&local_d0,&local_100,
                    (AlphaNum *)&absl_raw_log_internal_filename,in_R9);
  std::__cxx11::string::operator+=((string *)local_38,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
  ;
  tree._4_4_ = 3;
  tree._0_4_ = 0x2a6;
  base_internal::
  AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::
  operator()((AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
              *)raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)((long)&tree + 4),
             &local_138,(int *)&tree,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0x2a6,"void absl::Cord::RemovePrefix(size_t)");
}

Assistant:

void Cord::RemovePrefix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested prefix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.remove_prefix(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemovePrefix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      CordRep* old = tree;
      tree = tree->btree()->SubTree(n, tree->length - n);
      CordRep::Unref(old);
    } else if (tree->IsSubstring() && tree->refcount.IsOne()) {
      tree->substring()->start += n;
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, n, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}